

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workspace.c
# Opt level: O3

client * workspace_list_find_window_client(workspace_list *list,xcb_window_t window)

{
  client *pcVar1;
  size_t sVar2;
  node *pnVar3;
  
  if (list->count != 0) {
    sVar2 = 0;
    do {
      for (pnVar3 = list->workspaces[sVar2]->clients->head; pnVar3 != (node *)0x0;
          pnVar3 = pnVar3->next) {
        pcVar1 = (client *)pnVar3->data;
        if ((pcVar1 != (client *)0x0) && (pcVar1->window == window)) {
          return pcVar1;
        }
      }
      sVar2 = sVar2 + 1;
    } while (sVar2 != list->count);
  }
  return (client *)0x0;
}

Assistant:

struct client *workspace_list_find_window_client(const struct workspace_list *list,
                                                 xcb_window_t window)
{
        for (size_t i = 0; i < list->count; ++i) {
                struct workspace *workspace = list->workspaces[i];
                struct client *client = workspace_find_window_client(workspace, window);

                if (client != NULL) {
                        return client;
                }
        }

        return NULL;
}